

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::load_block_16_8(jpeg_encoder *this,int x,int c)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  int temp;
  int i;
  int b;
  int a;
  sample_array_t *pDst;
  uint8 *pSrc2;
  uint8 *pSrc1;
  int c_local;
  int x_local;
  jpeg_encoder *this_local;
  
  pDst = this->m_sample_array;
  iVar2 = x * 0x30 + c;
  a = 0;
  b = 2;
  for (i = 0; i < 0x10; i = i + 2) {
    pbVar4 = this->m_mcu_lines[i] + iVar2;
    pbVar3 = this->m_mcu_lines[i + 1] + iVar2;
    *pDst = ((int)((uint)*pbVar4 + (uint)pbVar4[3] + (uint)*pbVar3 + (uint)pbVar3[3] + a) >> 2) +
            -0x80;
    pDst[1] = ((int)((uint)pbVar4[6] + (uint)pbVar4[9] + (uint)pbVar3[6] + (uint)pbVar3[9] + b) >> 2
              ) + -0x80;
    pDst[2] = ((int)((uint)pbVar4[0xc] + (uint)pbVar4[0xf] + (uint)pbVar3[0xc] + (uint)pbVar3[0xf] +
                    a) >> 2) + -0x80;
    pDst[3] = ((int)((uint)pbVar4[0x12] + (uint)pbVar4[0x15] + (uint)pbVar3[0x12] +
                     (uint)pbVar3[0x15] + b) >> 2) + -0x80;
    pDst[4] = ((int)((uint)pbVar4[0x18] + (uint)pbVar4[0x1b] + (uint)pbVar3[0x18] +
                     (uint)pbVar3[0x1b] + a) >> 2) + -0x80;
    pDst[5] = ((int)((uint)pbVar4[0x1e] + (uint)pbVar4[0x21] + (uint)pbVar3[0x1e] +
                     (uint)pbVar3[0x21] + b) >> 2) + -0x80;
    pDst[6] = ((int)((uint)pbVar4[0x24] + (uint)pbVar4[0x27] + (uint)pbVar3[0x24] +
                     (uint)pbVar3[0x27] + a) >> 2) + -0x80;
    pDst[7] = ((int)((uint)pbVar4[0x2a] + (uint)pbVar4[0x2d] + (uint)pbVar3[0x2a] +
                     (uint)pbVar3[0x2d] + b) >> 2) + -0x80;
    iVar1 = b;
    b = a;
    pDst = pDst + 8;
    a = iVar1;
  }
  return;
}

Assistant:

void jpeg_encoder::load_block_16_8(int x, int c) {
  uint8 *pSrc1, *pSrc2;
  sample_array_t* pDst = m_sample_array;
  x = (x * (16 * 3)) + c;
  int a = 0, b = 2;
  for (int i = 0; i < 16; i += 2, pDst += 8) {
    pSrc1 = m_mcu_lines[i + 0] + x;
    pSrc2 = m_mcu_lines[i + 1] + x;
    pDst[0] = ((pSrc1[0 * 3] + pSrc1[1 * 3] + pSrc2[0 * 3] + pSrc2[1 * 3] + a) >> 2) - 128;
    pDst[1] = ((pSrc1[2 * 3] + pSrc1[3 * 3] + pSrc2[2 * 3] + pSrc2[3 * 3] + b) >> 2) - 128;
    pDst[2] = ((pSrc1[4 * 3] + pSrc1[5 * 3] + pSrc2[4 * 3] + pSrc2[5 * 3] + a) >> 2) - 128;
    pDst[3] = ((pSrc1[6 * 3] + pSrc1[7 * 3] + pSrc2[6 * 3] + pSrc2[7 * 3] + b) >> 2) - 128;
    pDst[4] = ((pSrc1[8 * 3] + pSrc1[9 * 3] + pSrc2[8 * 3] + pSrc2[9 * 3] + a) >> 2) - 128;
    pDst[5] = ((pSrc1[10 * 3] + pSrc1[11 * 3] + pSrc2[10 * 3] + pSrc2[11 * 3] + b) >> 2) - 128;
    pDst[6] = ((pSrc1[12 * 3] + pSrc1[13 * 3] + pSrc2[12 * 3] + pSrc2[13 * 3] + a) >> 2) - 128;
    pDst[7] = ((pSrc1[14 * 3] + pSrc1[15 * 3] + pSrc2[14 * 3] + pSrc2[15 * 3] + b) >> 2) - 128;
    int temp = a;
    a = b;
    b = temp;
  }
}